

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

inform_dist * inform_dist_realloc(inform_dist *dist,size_t n)

{
  ulong uVar1;
  uint32_t *puVar2;
  inform_dist *piVar3;
  size_t i;
  size_t sVar4;
  uint64_t uVar5;
  
  if (n != 0) {
    if (dist == (inform_dist *)0x0) {
      piVar3 = inform_dist_alloc(n);
      return piVar3;
    }
    if (dist->size != n) {
      puVar2 = (uint32_t *)realloc(dist->histogram,n * 4);
      if (puVar2 == (uint32_t *)0x0) {
        dist = (inform_dist *)0x0;
      }
      else {
        dist->histogram = puVar2;
        uVar1 = dist->size;
        if (n < uVar1) {
          dist->size = n;
          sVar4 = 0;
          uVar5 = 0;
          do {
            uVar5 = uVar5 + puVar2[sVar4];
            sVar4 = sVar4 + 1;
          } while (n != sVar4);
          dist->counts = uVar5;
        }
        else {
          if (uVar1 < n) {
            memset(puVar2 + uVar1,0,n * 4 + uVar1 * -4);
          }
          dist->size = n;
        }
      }
    }
  }
  return dist;
}

Assistant:

inform_dist* inform_dist_realloc(inform_dist *dist, size_t n)
{
    // if the requested size is zero, return the original distribution
    if (n == 0)
    {
        return dist;
    }
    // if the distribution is not NULL and the requested size is different
    // from the current size
    if (dist != NULL && dist->size != n)
    {
        // realloc the histogram
        uint32_t *histogram = realloc(dist->histogram, n * sizeof(uint32_t));
        // if the reallocation succeeded
        if (histogram != NULL)
        {
            // reset the distribution's histogram to the new histogram
            dist->histogram = histogram;
            // if the histogram was shrunken
            if (n < dist->size)
            {
                // set the new distribution size
                dist->size = n;
                // sum up the counts that are in the smaller support
                dist->counts = 0;
                for (size_t i = 0; i < dist->size; ++i)
                {
                    dist->counts += dist->histogram[i];
                }
            }
            // otherwise
            else
            {
                // zero out all of the newly observable events
                for (size_t i = dist->size; i < n; ++i)
                {
                    dist->histogram[i] = 0;
                }
                // set the size of the distribution
                dist->size = n;
            }
        }
        // otherwise
        else
        {
            // return NULL leaving the original distribution unscathed
            return NULL;
        }
    }
    // if the original distribution was NULL
    else if (dist == NULL)
    {
        // simply allocate the a new distribution of the requested size
        dist = inform_dist_alloc(n);
    }
    // return the (potentially NULL) distribution
    return dist;
}